

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  cmState *this_00;
  pointer pPVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  PolicyID id_00;
  pointer pPVar4;
  allocator local_49;
  string msg;
  
  if ((status != NEW) && (PVar2 = cmPolicies::GetPolicyStatus(id), PVar2 == REQUIRED_ALWAYS)) {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_00);
    IssueMessage(this,FATAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
    return false;
  }
  pPVar4 = (this->PolicyStack).
           super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pPVar4 == (this->PolicyStack).
                  super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start) break;
    cmPolicies::PolicyMap::Set(&pPVar4[-1].super_PolicyMap,id,status);
    pPVar1 = pPVar4 + -1;
    pPVar4 = pPVar4 + -1;
  } while (pPVar1->Weak != false);
  if (id == CMP0001 && status < NEW) {
    this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance->State;
    std::__cxx11::string::string((string *)&msg,"CMAKE_BACKWARDS_COMPATIBILITY",&local_49);
    pcVar3 = cmState::GetInitializedCacheValue(this_00,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::string((string *)&msg,"CMAKE_BACKWARDS_COMPATIBILITY",&local_49);
      AddCacheDefinition(this,&msg,"2.4",
                         "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                         ,STRING,false);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if(status != cmPolicies::NEW &&
     cmPolicies::GetPolicyStatus(id) ==
     cmPolicies::REQUIRED_ALWAYS)
    {
    std::string msg =
      cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
    }

  // Update the policy stack from the top to the top-most strong entry.
  bool previous_was_weak = true;
  for(PolicyStackType::reverse_iterator psi = this->PolicyStack.rbegin();
      previous_was_weak && psi != this->PolicyStack.rend(); ++psi)
    {
    psi->Set(id, status);
    previous_was_weak = psi->Weak;
    }

  // Special hook for presenting compatibility variable as soon as
  // the user requests it.
  if(id == cmPolicies::CMP0001 &&
     (status == cmPolicies::WARN || status == cmPolicies::OLD))
    {
    if(!(this->GetState()
         ->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")))
      {
      // Set it to 2.4 because that is the last version where the
      // variable had meaning.
      this->AddCacheDefinition
        ("CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
         "For backwards compatibility, what version of CMake "
         "commands and "
         "syntax should this version of CMake try to support.",
         cmState::STRING);
      }
    }

  return true;
}